

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O0

bool __thiscall pg::PTLSolver::search(PTLSolver *this,bitset *R,int top,int player)

{
  uint *__s;
  undefined8 __first;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  int iVar7;
  _label_vertex _Var8;
  bool local_1da;
  string local_150;
  undefined1 local_130 [16];
  int *local_110;
  int *curedge;
  Game *pGStack_100;
  bool closed_region;
  int local_f8;
  _label_vertex local_f0;
  Game *local_e0;
  int local_d8;
  _label_vertex local_d0;
  size_t local_c0;
  size_t v_1;
  undefined1 local_b0 [4];
  int v;
  uint local_9c;
  int local_98;
  int pl;
  int pr;
  undefined1 local_88 [24];
  bitset Z;
  uint uStack_4c;
  bool changes;
  int player_local;
  int top_local;
  bitset *R_local;
  PTLSolver *this_local;
  char local_11;
  bitset *local_10;
  
  Z._allocsize._7_1_ = 0;
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)(local_88 + 0x10),sVar4);
  uStack_4c = top;
  do {
    bVar1 = Z._allocsize._7_1_;
    if (uStack_4c == 0xffffffff) {
      bitset::~bitset((bitset *)(local_88 + 0x10));
      return (bool)(bVar1 & 1);
    }
    bitset::operator[]((bitset *)local_88,(size_t)R);
    bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_88);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_98 = Solver::priority(&this->super_Solver,uStack_4c);
      local_9c = Solver::priority(&this->super_Solver,uStack_4c);
      local_9c = local_9c & 1;
      bitset::operator[]((bitset *)local_b0,(size_t)(local_88 + 0x10));
      bitset::reference::operator=((reference *)local_b0,true);
      this->str[(int)uStack_4c] = -1;
      iVar7 = (this->Q).pointer;
      (this->Q).pointer = iVar7 + 1;
      (this->Q).queue[iVar7] = uStack_4c;
      while ((this->Q).pointer != 0) {
        iVar7 = (this->Q).pointer + -1;
        (this->Q).pointer = iVar7;
        v_1._4_4_ = (this->Q).queue[iVar7];
        attractVertices(this,local_9c,v_1._4_4_,R,(bitset *)(local_88 + 0x10),R);
        if (1 - local_9c != player) {
          attractTangles(this,local_9c,v_1._4_4_,R,(bitset *)(local_88 + 0x10),R);
        }
      }
      if (1 < (this->super_Solver).trace) {
        poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m \x1b[1;36m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_98);
        std::operator<<(poVar5,"\x1b[m");
        for (local_c0 = bitset::find_first((bitset *)(local_88 + 0x10));
            local_c0 != 0xffffffffffffffff;
            local_c0 = bitset::find_next((bitset *)(local_88 + 0x10),local_c0)) {
          poVar5 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
          _Var8 = Solver::label_vertex(&this->super_Solver,(int)local_c0);
          local_e0 = _Var8.g;
          local_d8 = _Var8.v;
          local_d0.g = local_e0;
          local_d0.v = local_d8;
          poVar5 = operator<<(poVar5,&local_d0);
          std::operator<<(poVar5,"\x1b[m");
          if (this->str[local_c0] != -1) {
            poVar5 = std::operator<<((this->super_Solver).logger,"->");
            _Var8 = Solver::label_vertex(&this->super_Solver,this->str[local_c0]);
            pGStack_100 = _Var8.g;
            local_f8 = _Var8.v;
            local_f0.g = pGStack_100;
            local_f0.v = local_f8;
            operator<<(poVar5,&local_f0);
          }
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
      if ((player == -1) || (local_9c == player)) {
        curedge._7_1_ = 1;
        uVar3 = Solver::owner(&this->super_Solver,uStack_4c);
        if (uVar3 == local_9c) {
          if (this->str[(int)uStack_4c] == -1) {
            curedge._7_1_ = 0;
          }
        }
        else {
          for (local_110 = Solver::outs(&this->super_Solver,uStack_4c); *local_110 != -1;
              local_110 = local_110 + 1) {
            bitset::operator[]((bitset *)&stack0xfffffffffffffee0,(size_t)(local_88 + 0x10));
            bVar2 = bitset::reference::operator_cast_to_bool((reference *)&stack0xfffffffffffffee0);
            local_1da = false;
            if (!bVar2) {
              bitset::operator[]((bitset *)local_130,(size_t)R);
              local_1da = bitset::reference::operator_cast_to_bool((reference *)local_130);
            }
            if (local_1da != false) {
              curedge._7_1_ = 0;
              break;
            }
          }
        }
        if ((curedge._7_1_ & 1) == 0) {
          std::__cxx11::to_string(&local_150,local_98);
          std::__cxx11::string::operator=((string *)&this->path,(string *)&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          bVar2 = search_rec(this,(bitset *)(local_88 + 0x10),uStack_4c,local_9c,R);
          Z._allocsize._7_1_ = (Z._allocsize._7_1_ & 1) != 0 || bVar2;
        }
        else {
          __s = this->pea_vidx;
          lVar6 = Solver::nodecount(&this->super_Solver);
          memset(__s,0,lVar6 << 2);
          this->pea_curidx = 1;
          bVar2 = extractTangles(this,uStack_4c,(bitset *)(local_88 + 0x10),this->str);
          Z._allocsize._7_1_ = (Z._allocsize._7_1_ & 1) != 0 || bVar2;
        }
      }
      bitset::operator-=(R,(bitset *)(local_88 + 0x10));
      __first = local_88._16_8_;
      local_10 = (bitset *)(local_88 + 0x10);
      sVar4 = bitset::num_blocks(local_10);
      local_11 = '\0';
      std::fill<unsigned_long*,char>
                ((unsigned_long *)__first,(unsigned_long *)(__first + sVar4 * 8),&local_11);
    }
    uStack_4c = uStack_4c - 1;
  } while( true );
}

Assistant:

bool
PTLSolver::search(bitset &R, int top, int player)
{
    bool changes = false;

    bitset Z(nodecount());

    // Partition the game <R>

    for (; top!=-1; top--) {
        // find next top
        if (!R[top]) continue;

        const int pr = priority(top);
        const int pl = priority(top)&1;

        Z[top] = true; // add to <Z>
        str[top] = -1;
        Q.push(top);

        while (Q.nonempty()) {
            const int v = Q.pop();
            /*/ R[v] = false; // remove from <R> */
            attractVertices(pl, v, R, Z, R);
            // attract tangles if correct player, or <player> equals -1
            if ((1-pl) != player) attractTangles(pl, v, R, Z, R);
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m \033[1;36m" << pr << "\033[m";
            for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
        }
#endif

        if (player == -1 or pl == player) {
            /**
             * Now Z is the current region and <top> the top vertex
             */

            bool closed_region = true;

            /**
             * Check if Z is locally closed by looking at <top>.
             */

            if (owner(top) == pl) {
                if (str[top] == -1) closed_region = false;
            } else {
                for (auto curedge = outs(top); *curedge != -1; curedge++) {
                    if (!Z[*curedge] and R[*curedge]) {
                        closed_region = false;
                        break;
                    }
                }
            }

            if (closed_region) {
                /**
                 * Extract tangles by computing SCCs starting at each top vertex.
                 * Note: each bottom SCC must contain a head vertex.
                 */

                memset(pea_vidx, 0, sizeof(int[nodecount()]));
                pea_curidx = 1;
                changes |= extractTangles(top, Z, str);
            } else {
                /**
                 * Not a closed region, go recursive.
                 */

               // initialize path (for trace output) to <pr>
               path = std::to_string(pr);
               changes |= search_rec(Z, top, pl, R);
            }
        }

        R -= Z;
        Z.reset();
    }

    return changes;
}